

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O3

void ncnn::conv3x3s1_pack8to1_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  void *pvVar18;
  void *pvVar19;
  size_t sVar20;
  size_t sVar21;
  void *pvVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  void *pvVar35;
  ulong uVar36;
  long lVar37;
  undefined1 (*pauVar38) [32];
  long lVar39;
  void *pvVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  float fVar48;
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float in_register_0000159c;
  float in_register_000015dc;
  
  iVar13 = top_blob->c;
  if (0 < (long)iVar13) {
    iVar14 = top_blob->w;
    uVar15 = top_blob->h;
    uVar16 = bottom_blob->c;
    iVar17 = top_blob->dims;
    pvVar18 = top_blob->data;
    lVar29 = top_blob->cstep * top_blob->elemsize;
    pvVar19 = kernel->data;
    sVar20 = kernel->cstep;
    sVar21 = kernel->elemsize;
    pvVar22 = bottom_blob->data;
    lVar32 = bottom_blob->cstep * bottom_blob->elemsize;
    lVar28 = (long)bottom_blob->w * bottom_blob->elemsize;
    lVar31 = 0;
    auVar45 = ZEXT3264(_DAT_00314260);
    auVar47 = ZEXT3264(_DAT_00314280);
    auVar50 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    pvVar35 = pvVar18;
    do {
      auVar51 = ZEXT1664(auVar50);
      auVar49._28_4_ = 0.0;
      iVar34 = 1;
      if (iVar17 != 3) {
        iVar34 = top_blob->d;
      }
      if (_bias == (Mat *)0x0) {
        auVar53 = ZEXT816(0) << 0x40;
      }
      else {
        auVar53 = ZEXT416(*(uint *)((long)&_bias->data + lVar31 * 4));
      }
      uVar24 = iVar34 * uVar15 * iVar14;
      if (0 < (int)uVar24) {
        auVar55._8_8_ = 0;
        auVar55._0_8_ = (ulong)uVar24 - 1;
        auVar55 = vpshufd_avx(auVar55,0x44);
        auVar53 = vshufps_avx(auVar53,auVar53,0);
        auVar54._16_16_ = auVar53;
        auVar54._0_16_ = auVar53;
        uVar26 = auVar55._0_8_;
        auVar53._0_8_ = uVar26 ^ 0x8000000000000000;
        auVar53._8_4_ = auVar55._8_4_;
        uVar23 = auVar55._12_4_;
        auVar53._12_4_ = uVar23 ^ 0x80000000;
        auVar56._0_8_ = uVar26 ^ 0x8000000000000000;
        auVar56._8_4_ = auVar53._8_4_;
        auVar56._12_4_ = uVar23 ^ 0x80000000;
        auVar57._0_8_ = uVar26 ^ 0x8000000000000000;
        auVar57._8_4_ = auVar53._8_4_;
        auVar57._12_4_ = uVar23 ^ 0x80000000;
        uVar26 = 0;
        do {
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar26;
          auVar55 = vpshufd_avx(auVar58,0x44);
          auVar60._16_16_ = auVar55;
          auVar60._0_16_ = auVar55;
          auVar61 = vorps_avx(auVar60,auVar45._0_32_);
          auVar60 = vorps_avx(auVar60,auVar47._0_32_);
          auVar63._0_8_ = auVar60._16_8_ ^ 0x8000000000000000;
          auVar63._8_4_ = auVar60._24_4_;
          auVar63._12_4_ = auVar60._28_4_ ^ 0x80000000;
          auVar55 = vpcmpgtq_avx(auVar63,auVar53);
          auVar59._0_8_ = auVar60._0_8_ ^ 0x8000000000000000;
          auVar59._8_4_ = auVar60._8_4_;
          auVar59._12_4_ = auVar60._12_4_ ^ 0x80000000;
          auVar58 = vpcmpgtq_avx(auVar59,auVar56);
          auVar55 = vpackssdw_avx(auVar58,auVar55);
          auVar64._0_8_ = auVar61._16_8_ ^ 0x8000000000000000;
          auVar64._8_4_ = auVar61._24_4_;
          auVar64._12_4_ = auVar61._28_4_ ^ 0x80000000;
          auVar58 = vpcmpgtq_avx(auVar64,auVar53);
          auVar62._0_8_ = auVar61._0_8_ ^ 0x8000000000000000;
          auVar62._8_4_ = auVar61._8_4_;
          auVar62._12_4_ = auVar61._12_4_ ^ 0x80000000;
          auVar59 = vpcmpgtq_avx(auVar62,auVar57);
          auVar58 = vpackssdw_avx(auVar59,auVar58);
          auVar55 = vpackssdw_avx(auVar58 ^ auVar50,auVar55 ^ auVar50);
          auVar58 = vpmovsxwd_avx(auVar55);
          auVar55 = vpunpckhwd_avx(auVar55,auVar55);
          auVar61._16_16_ = auVar55;
          auVar61._0_16_ = auVar58;
          auVar61 = vmaskmovps_avx(auVar61,auVar54);
          *(undefined1 (*) [32])((long)pvVar35 + uVar26 * 4) = auVar61;
          uVar26 = uVar26 + 8;
        } while ((uVar24 + 7 & 0xfffffff8) != uVar26);
      }
      if (0 < (int)uVar16) {
        pauVar38 = (undefined1 (*) [32])(sVar20 * sVar21 * lVar31 + (long)pvVar19);
        uVar26 = 0;
        lVar27 = (long)pvVar22 + lVar28 + 0x40;
        lVar33 = (long)pvVar22 + lVar28 * 2 + 0x40;
        lVar39 = (long)pvVar22 + 0x40;
        do {
          if (0 < (int)uVar15) {
            auVar54 = *pauVar38;
            auVar61 = pauVar38[1];
            auVar60 = pauVar38[2];
            auVar7 = pauVar38[3];
            auVar8 = pauVar38[4];
            auVar9 = pauVar38[5];
            auVar10 = pauVar38[6];
            auVar11 = pauVar38[7];
            auVar12 = pauVar38[8];
            uVar36 = 0;
            lVar25 = lVar39;
            lVar30 = lVar27;
            lVar37 = lVar33;
            pvVar40 = (void *)(lVar29 * lVar31 + (long)pvVar18);
            do {
              if (0 < iVar14) {
                lVar41 = 0;
                auVar52 = auVar51;
                iVar34 = iVar14;
                do {
                  pfVar3 = (float *)(lVar25 + -0x40 + lVar41 * 8);
                  pfVar4 = (float *)(lVar25 + -0x20 + lVar41 * 8);
                  pfVar1 = (float *)(lVar25 + lVar41 * 8);
                  pfVar5 = (float *)(lVar30 + -0x40 + lVar41 * 8);
                  fVar48 = in_register_0000159c + auVar47._28_4_;
                  pfVar6 = (float *)(lVar30 + -0x20 + lVar41 * 8);
                  pfVar2 = (float *)(lVar30 + lVar41 * 8);
                  auVar47._0_4_ = auVar9._0_4_ * *pfVar2;
                  auVar47._4_4_ = auVar9._4_4_ * pfVar2[1];
                  auVar47._8_4_ = auVar9._8_4_ * pfVar2[2];
                  auVar47._12_4_ = auVar9._12_4_ * pfVar2[3];
                  auVar47._16_4_ = auVar9._16_4_ * pfVar2[4];
                  auVar47._20_4_ = auVar9._20_4_ * pfVar2[5];
                  auVar47._28_36_ = auVar52._28_36_;
                  auVar47._24_4_ = auVar9._24_4_ * pfVar2[6];
                  auVar51 = ZEXT3264(auVar47._0_32_);
                  pfVar2 = (float *)(lVar37 + -0x40 + lVar41 * 8);
                  in_register_0000159c = in_register_0000159c + in_register_000015dc;
                  auVar46._0_4_ =
                       auVar54._0_4_ * *pfVar3 + auVar7._0_4_ * *pfVar5 + auVar10._0_4_ * *pfVar2;
                  auVar46._4_4_ =
                       auVar54._4_4_ * pfVar3[1] + auVar7._4_4_ * pfVar5[1] +
                       auVar10._4_4_ * pfVar2[1];
                  auVar46._8_4_ =
                       auVar54._8_4_ * pfVar3[2] + auVar7._8_4_ * pfVar5[2] +
                       auVar10._8_4_ * pfVar2[2];
                  auVar46._12_4_ =
                       auVar54._12_4_ * pfVar3[3] + auVar7._12_4_ * pfVar5[3] +
                       auVar10._12_4_ * pfVar2[3];
                  auVar46._16_4_ =
                       auVar54._16_4_ * pfVar3[4] + auVar7._16_4_ * pfVar5[4] +
                       auVar10._16_4_ * pfVar2[4];
                  auVar46._20_4_ =
                       auVar54._20_4_ * pfVar3[5] + auVar7._20_4_ * pfVar5[5] +
                       auVar10._20_4_ * pfVar2[5];
                  auVar46._24_4_ =
                       auVar54._24_4_ * pfVar3[6] + auVar7._24_4_ * pfVar5[6] +
                       auVar10._24_4_ * pfVar2[6];
                  auVar46._28_4_ = fVar48 + auVar49._28_4_;
                  pfVar2 = (float *)(lVar37 + -0x20 + lVar41 * 8);
                  auVar49._0_4_ =
                       auVar8._0_4_ * *pfVar6 + auVar61._0_4_ * *pfVar4 + auVar11._0_4_ * *pfVar2;
                  auVar49._4_4_ =
                       auVar8._4_4_ * pfVar6[1] + auVar61._4_4_ * pfVar4[1] +
                       auVar11._4_4_ * pfVar2[1];
                  auVar49._8_4_ =
                       auVar8._8_4_ * pfVar6[2] + auVar61._8_4_ * pfVar4[2] +
                       auVar11._8_4_ * pfVar2[2];
                  auVar49._12_4_ =
                       auVar8._12_4_ * pfVar6[3] + auVar61._12_4_ * pfVar4[3] +
                       auVar11._12_4_ * pfVar2[3];
                  auVar49._16_4_ =
                       auVar8._16_4_ * pfVar6[4] + auVar61._16_4_ * pfVar4[4] +
                       auVar11._16_4_ * pfVar2[4];
                  auVar49._20_4_ =
                       auVar8._20_4_ * pfVar6[5] + auVar61._20_4_ * pfVar4[5] +
                       auVar11._20_4_ * pfVar2[5];
                  auVar49._24_4_ =
                       auVar8._24_4_ * pfVar6[6] + auVar61._24_4_ * pfVar4[6] +
                       auVar11._24_4_ * pfVar2[6];
                  auVar49._28_4_ = in_register_0000159c + auVar49._28_4_;
                  auVar46 = vhaddps_avx(auVar46,auVar49);
                  pfVar2 = (float *)(lVar37 + lVar41 * 8);
                  auVar44._0_4_ = auVar47._0_4_ + auVar60._0_4_ * *pfVar1 + auVar12._0_4_ * *pfVar2;
                  auVar44._4_4_ =
                       auVar47._4_4_ + auVar60._4_4_ * pfVar1[1] + auVar12._4_4_ * pfVar2[1];
                  auVar44._8_4_ =
                       auVar47._8_4_ + auVar60._8_4_ * pfVar1[2] + auVar12._8_4_ * pfVar2[2];
                  auVar44._12_4_ =
                       auVar47._12_4_ + auVar60._12_4_ * pfVar1[3] + auVar12._12_4_ * pfVar2[3];
                  auVar44._16_4_ =
                       auVar47._16_4_ + auVar60._16_4_ * pfVar1[4] + auVar12._16_4_ * pfVar2[4];
                  auVar44._20_4_ =
                       auVar47._20_4_ + auVar60._20_4_ * pfVar1[5] + auVar12._20_4_ * pfVar2[5];
                  auVar44._24_4_ =
                       auVar47._24_4_ + auVar60._24_4_ * pfVar1[6] + auVar12._24_4_ * pfVar2[6];
                  auVar44._28_4_ = auVar52._28_4_ + auVar45._28_4_ + auVar49._28_4_;
                  auVar44 = vhaddps_avx(auVar44,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar46 = vhaddps_avx(auVar46,auVar44);
                  auVar42._0_4_ = auVar46._16_4_ + auVar46._0_4_;
                  auVar42._4_4_ = auVar46._20_4_ + auVar46._4_4_;
                  auVar42._8_4_ = auVar46._24_4_ + auVar46._8_4_;
                  auVar42._12_4_ = auVar46._28_4_ + auVar46._12_4_;
                  auVar50 = vshufpd_avx(auVar42,auVar42,1);
                  auVar43._0_4_ = auVar50._0_4_ + auVar42._0_4_;
                  auVar43._4_4_ = auVar50._4_4_ + auVar42._4_4_;
                  auVar43._8_4_ = auVar50._8_4_ + auVar42._8_4_;
                  auVar43._12_4_ = auVar50._12_4_ + auVar42._12_4_;
                  auVar50 = vmovshdup_avx(auVar43);
                  fVar48 = auVar50._0_4_ + *(float *)((long)pvVar40 + lVar41);
                  auVar47 = ZEXT464((uint)fVar48);
                  fVar48 = fVar48 + auVar43._0_4_;
                  auVar45 = ZEXT464((uint)fVar48);
                  *(float *)((long)pvVar40 + lVar41) = fVar48;
                  lVar41 = lVar41 + 4;
                  iVar34 = iVar34 + -1;
                  auVar52 = auVar51;
                } while (iVar34 != 0);
                pvVar40 = (void *)((long)pvVar40 + lVar41);
              }
              uVar36 = uVar36 + 1;
              lVar25 = lVar25 + lVar28;
              lVar30 = lVar30 + lVar28;
              lVar37 = lVar37 + lVar28;
            } while (uVar36 != uVar15);
          }
          auVar50 = auVar51._0_16_;
          pauVar38 = pauVar38 + 9;
          uVar26 = uVar26 + 1;
          lVar39 = lVar39 + lVar32;
          lVar27 = lVar27 + lVar32;
          lVar33 = lVar33 + lVar32;
        } while (uVar26 != uVar16);
      }
      lVar31 = lVar31 + 1;
      pvVar35 = (void *)((long)pvVar35 + lVar29);
      auVar45 = ZEXT3264(_DAT_00314260);
      auVar47 = ZEXT3264(_DAT_00314280);
      auVar50 = vpcmpeqd_avx(auVar50,auVar50);
    } while (lVar31 != iVar13);
  }
  return;
}

Assistant:

static void conv3x3s1_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);
                int j = 0;
                for (; j < outw; j++)
                {
                    __m256 _r00 = _mm256_loadu_ps(r0);
                    __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                    __m256 _r02 = _mm256_loadu_ps(r0 + 16);

                    __m256 _sum0 = _mm256_mul_ps(_k00, _r00);
                    __m256 _sum1 = _mm256_mul_ps(_k01, _r01);
                    __m256 _sum2 = _mm256_mul_ps(_k02, _r02);

                    __m256 _r10 = _mm256_loadu_ps(r1);
                    __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                    __m256 _r12 = _mm256_loadu_ps(r1 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k12, _r12, _sum2);

                    __m256 _r20 = _mm256_loadu_ps(r2);
                    __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                    __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k22, _r22, _sum2);
                    __m128 _sum = HorizontalSums(_sum0, _sum1, _sum2);

                    *outptr0 += _mm_reduce_add_ps(_sum); // dot
                    outptr0++;
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                }
            }

            k0 += 9 * 8;
        }
    }
}